

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O0

unsigned_long __thiscall
jsoncons::basic_staj_event<char>::get<unsigned_long>(basic_staj_event<char> *this)

{
  error_code ec_00;
  bool bVar1;
  error_category *peVar2;
  undefined8 uVar3;
  error_code *in_RDI;
  unsigned_long val;
  error_code ec;
  error_code *in_stack_ffffffffffffffd8;
  basic_staj_event<char> *in_stack_ffffffffffffffe0;
  error_code local_18;
  
  std::error_code::error_code(in_RDI);
  peVar2 = (error_category *)get<unsigned_long>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8)
  ;
  bVar1 = std::error_code::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    return (unsigned_long)peVar2;
  }
  uVar3 = __cxa_allocate_exception(0x58);
  ec_00._M_cat = peVar2;
  ec_00._0_8_ = in_stack_ffffffffffffffd8;
  ser_error::ser_error((ser_error *)local_18._M_cat,ec_00);
  __cxa_throw(uVar3,&ser_error::typeinfo,ser_error::~ser_error);
}

Assistant:

T get() const
    {
        std::error_code ec;
        T val = get<T>(ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            JSONCONS_THROW(ser_error(ec));
        }
        return val;
    }